

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::lookup_path_or_modify(Tree *this,csubstr default_value,csubstr path,size_t start)

{
  Location loc;
  csubstr path_00;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  NodeData *pNVar4;
  size_t in_RCX;
  Tree *in_R8;
  size_t in_R9;
  type_bits in_stack_00000050;
  size_t in_stack_00000058;
  Tree *in_stack_00000060;
  csubstr in_stack_00000068;
  size_t target;
  type_bits in_stack_00000110;
  size_t in_stack_fffffffffffffef8;
  Tree *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  Location *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff48;
  Tree *in_stack_ffffffffffffff50;
  Tree *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff78;
  
  path_00.len = in_R9;
  path_00.str = in_stack_ffffffffffffff78;
  sVar3 = _lookup_path_or_create(in_R8,path_00,in_RCX);
  bVar1 = has_parent(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (!bVar1) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    loc.super_LineCol.line = in_RCX;
    loc.super_LineCol.offset = in_stack_ffffffffffffff60;
    loc.super_LineCol.col = (size_t)in_R8;
    loc.name.str = (char *)sVar3;
    loc.name.len = in_R9;
    error<31ul>((char (*) [31])in_stack_ffffffffffffff50,loc);
  }
  _p(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pNVar4 = _p(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (((pNVar4->m_type).type & MAP) == NOTYPE) {
    to_val(in_stack_00000060,in_stack_00000058,in_stack_00000068,in_stack_00000050);
  }
  else {
    key(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
    to_keyval(this,start,default_value,path,in_stack_00000110);
  }
  return sVar3;
}

Assistant:

size_t Tree::lookup_path_or_modify(csubstr default_value, csubstr path, size_t start)
{
    size_t target = _lookup_path_or_create(path, start);
    if(parent_is_map(target))
        to_keyval(target, key(target), default_value);
    else
        to_val(target, default_value);
    return target;
}